

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_bin_lower_slab(tsdn_t *tsdn,arena_t *arena,extent_t *slab,bin_t *bin)

{
  extent_t *slab_00;
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  slab_00 = (extent_t *)(slab->field_5).e_slab_data.bitmap[6];
  if (slab_00 != (extent_t *)0x0) {
    uVar4 = slab_00->e_bits >> 0x2a;
    uVar5 = *(ulong *)arena->nthreads >> 0x2a;
    iVar3 = (uint)(uVar5 < uVar4) - (uint)(uVar4 < uVar5);
    if (iVar3 == 0) {
      pvVar1 = slab_00->e_addr;
      pvVar2 = *(void **)&arena->binshard_next;
      iVar3 = (uint)(pvVar1 >= pvVar2 && pvVar1 != pvVar2) - (uint)(pvVar1 < pvVar2);
    }
    if (0 < iVar3) {
      if ((slab_00->e_bits & 0xffc000000) == 0) {
        arena_bin_slabs_full_insert((arena_t *)tsdn,(bin_t *)slab,slab_00);
      }
      else {
        arena_bin_slabs_nonfull_insert((bin_t *)slab,slab_00);
      }
      (slab->field_5).e_slab_data.bitmap[6] = (bitmap_t)arena;
      slab[1].field_5.e_slab_data.bitmap[0] = slab[1].field_5.e_slab_data.bitmap[0] + 1;
      return;
    }
  }
  arena_bin_slabs_nonfull_insert((bin_t *)slab,(extent_t *)arena);
  return;
}

Assistant:

static void
arena_bin_lower_slab(tsdn_t *tsdn, arena_t *arena, extent_t *slab,
    bin_t *bin) {
	assert(extent_nfree_get(slab) > 0);

	/*
	 * Make sure that if bin->slabcur is non-NULL, it refers to the
	 * oldest/lowest non-full slab.  It is okay to NULL slabcur out rather
	 * than proactively keeping it pointing at the oldest/lowest non-full
	 * slab.
	 */
	if (bin->slabcur != NULL && extent_snad_comp(bin->slabcur, slab) > 0) {
		/* Switch slabcur. */
		if (extent_nfree_get(bin->slabcur) > 0) {
			arena_bin_slabs_nonfull_insert(bin, bin->slabcur);
		} else {
			arena_bin_slabs_full_insert(arena, bin, bin->slabcur);
		}
		bin->slabcur = slab;
		if (config_stats) {
			bin->stats.reslabs++;
		}
	} else {
		arena_bin_slabs_nonfull_insert(bin, slab);
	}
}